

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O0

bool __thiscall mpt::pipe<int>::pop(pipe<int> *this,int *data)

{
  ulong uVar1;
  int *t;
  instance *piStack_28;
  uint8_t buf [4];
  queue *d;
  int *data_local;
  pipe<int> *this_local;
  
  piStack_28 = reference<mpt::pipe<int>::instance>::instance(&this->_d);
  if (piStack_28 == (instance *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = (**(code **)(*(long *)&piStack_28->super_type + 0x50))(piStack_28,(long)&t + 4,4);
    if ((uVar1 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      if (data != (int *)0x0) {
        *data = t._4_4_;
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool pop(T *data = 0) const
	{
		io::queue *d;
		if (!(d = _d.instance())) {
			return false;
		}
		uint8_t buf[sizeof(T)];
		T *t = static_cast<T *>(static_cast<void *>(buf));
		if (!d->pop(t, sizeof(T))) {
			return false;
		}
		if (data) {
			*data = *t;
		} else {
			t->~T();
		}
		return true;
	}